

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O0

void __thiscall crnlib::random::seed(random *this,uint32 i)

{
  uint uVar1;
  uint uVar2;
  uint in_ESI;
  random *in_RDI;
  uint32 i3;
  uint32 i2;
  uint32 i1;
  uint32 jcong;
  uint32 jsr;
  
  uVar1 = in_ESI << 0x11 ^ in_ESI;
  uVar1 = uVar1 >> 0xd ^ uVar1;
  uVar1 = uVar1 << 5 ^ uVar1;
  uVar1 = uVar1 << 0x11 ^ uVar1;
  uVar1 = uVar1 >> 0xd ^ uVar1;
  uVar1 = uVar1 << 5 ^ uVar1;
  uVar2 = uVar1 ^ 0xffffffff;
  uVar1 = uVar1 << 0x11 ^ uVar1;
  uVar1 = uVar1 >> 0xd ^ uVar1;
  uVar1 = uVar1 << 5 ^ uVar1;
  uVar1 = uVar1 << 0x11 ^ uVar1;
  uVar1 = uVar1 >> 0xd ^ uVar1;
  uVar1 = uVar1 << 5 ^ uVar1;
  uVar1 = uVar1 << 0x11 ^ uVar1;
  uVar1 = uVar1 >> 0xd ^ uVar1;
  seed(in_RDI,in_ESI,uVar1 << 5 ^ uVar1,
       (((((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) *
           0x10dcd + 0x12d687) * 0x10dcd + 0x12d687) * 0x10dcd + 0x12d687) * 0x10dcd + 0x12d687) *
       0x10dcd + 0x12d687);
  return;
}

Assistant:

void random::seed(uint32 i) {
  uint32 jsr = i;
  SHR3;
  SHR3;
  uint32 jcong = utils::swap32(~jsr);
  CONG;
  CONG;
  uint32 i1 = SHR3 ^ CONG;
  uint32 i2 = SHR3 ^ CONG;
  uint32 i3 = SHR3 + CONG;
  seed(i1, i2, i3);
}